

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.cpp
# Opt level: O0

Node * mainposition(Table *t,TValue *key)

{
  TValue *key_local;
  Table *t_local;
  
  switch(key->tt) {
  case 1:
    t_local = (Table *)(t->node + (int)((key->value).b & (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  case 2:
    t_local = (Table *)(t->node +
                       ((ulong)(key->value).gc & 0xffffffff) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
    break;
  case 3:
    t_local = (Table *)hashnum(t,(key->value).n);
    break;
  case 4:
    t_local = (Table *)(t->node +
                       (int)(*(uint *)((long)(key->value).gc + 0xc) &
                            (1 << (t->lsizenode & 0x1f)) - 1U));
    break;
  default:
    t_local = (Table *)(t->node +
                       ((ulong)(key->value).gc & 0xffffffff) %
                       (ulong)((1 << (t->lsizenode & 0x1f)) - 1U | 1));
  }
  return (Node *)t_local;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMBER:
      return hashnum(t, nvalue(key));
    case LUA_TSTRING:
      return hashstr(t, rawtsvalue(key));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    default:
      return hashpointer(t, gcvalue(key));
  }
}